

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# landb.cpp
# Opt level: O1

db_bit * __thiscall lan::db::get_array_bit(db *this,db_bits *array,size_t index)

{
  db_bit *buffer;
  
  if (array->type == Array) {
    array = array->lin;
    if (array == (db_bit *)0x0) {
      return (db_bit *)0x0;
    }
    if (index != 0) {
      do {
        if (array == (db_bit *)0x0) {
          return (db_bit *)0x0;
        }
        array = array->nex;
        index = index - 1;
      } while (index != 0);
    }
  }
  return array;
}

Assistant:

lan::db_bit * db::get_array_bit(lan::db_bits * array, size_t index){
            lan::db_bit * buffer = array;
            if(array->type == lan::Array and (buffer = buffer->lin)){
                for(register_t i = 0 ; i < index ; i++, buffer = buffer->nex){
                    if(!buffer)
                        return nullptr;
                }
            } return buffer;
        }